

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::DropEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool allow_drop_internal)

{
  pointer pcVar1;
  optional_ptr<duckdb::Transaction,_true> transaction_p;
  transaction_t tVar2;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> _Var3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  int iVar5;
  optional_ptr<duckdb::CatalogEntry,_true> oVar6;
  undefined4 extraout_var;
  InCatalogEntry *this_00;
  pointer pIVar7;
  DuckTransactionManager *this_01;
  type entry_00;
  CatalogException *this_02;
  pointer __p;
  templated_unique_single_t value;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_88;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_80;
  optional_ptr<duckdb::CatalogEntry,_true> local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  oVar6 = GetEntryInternal(this,transaction,name);
  if (oVar6.ptr != (CatalogEntry *)0x0) {
    local_78 = oVar6;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    if ((local_78.ptr)->internal == true && !allow_drop_internal) {
      this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "Cannot drop entry \"%s\" because it is an internal system entry","");
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = ((local_78.ptr)->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + ((local_78.ptr)->name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>(this_02,&local_70,&local_50);
      __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    (*(local_78.ptr)->_vptr_CatalogEntry[6])();
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    iVar5 = (*(local_78.ptr)->_vptr_CatalogEntry[0xb])();
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_78);
    oVar4.ptr = local_78.ptr;
    this_00 = (InCatalogEntry *)operator_new(0xe0);
    pcVar1 = ((oVar4.ptr)->name)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + ((oVar4.ptr)->name)._M_string_length);
    InCatalogEntry::InCatalogEntry
              (this_00,DELETED_ENTRY,(Catalog *)CONCAT44(extraout_var,iVar5),&local_70);
    local_88._M_head_impl = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    tVar2 = transaction.transaction_id;
    pIVar7 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_88);
    LOCK();
    (pIVar7->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar2;
    UNLOCK();
    pIVar7 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_88);
    (pIVar7->super_CatalogEntry).set.ptr = this;
    pIVar7 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_88);
    _Var3._M_head_impl = local_88._M_head_impl;
    (pIVar7->super_CatalogEntry).deleted = true;
    local_88._M_head_impl = (InCatalogEntry *)0x0;
    local_80._M_head_impl = _Var3._M_head_impl;
    CatalogEntryMap::UpdateEntry
              (&this->map,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_80);
    if (local_80._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_80._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    local_80._M_head_impl = (InCatalogEntry *)0x0;
    if (transaction.transaction.ptr != (Transaction *)0x0) {
      this_01 = DuckTransactionManager::Get((this->catalog->super_Catalog).db);
      optional_ptr<duckdb::Transaction,_true>::CheckValid(&transaction.transaction);
      transaction_p = transaction.transaction;
      entry_00 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
                 operator*(&((_Var3._M_head_impl)->super_CatalogEntry).child);
      DuckTransactionManager::PushCatalogEntry(this_01,transaction_p.ptr,entry_00,(data_ptr_t)0x0,0)
      ;
    }
    if (local_88._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_88._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
  }
  return oVar6.ptr != (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::DropEntryInternal(CatalogTransaction transaction, const string &name, bool allow_drop_internal) {
	// lock the catalog for writing
	// we can only delete an entry that exists
	auto entry = GetEntryInternal(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}

	entry->OnDrop();

	// create a new tombstone entry and replace the currently stored one
	// set the timestamp to the timestamp of the current transaction
	// and point it at the tombstone node
	auto value = make_uniq<InCatalogEntry>(CatalogType::DELETED_ENTRY, entry->ParentCatalog(), entry->name);
	value->timestamp = transaction.transaction_id;
	value->set = this;
	value->deleted = true;
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));

	// push the old entry in the undo buffer for this transaction
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}